

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
          (Generator *this,Descriptor *descriptor,DescriptorProto *proto)

{
  Printer *this_00;
  int i32;
  LogMessage *other;
  AlphaNum *a;
  AlphaNum *a_00;
  string sp;
  string local_b8;
  string local_98;
  LogMessage local_78;
  AlphaNum local_40;
  
  Descriptor::CopyTo(descriptor,proto);
  sp._M_dataplus._M_p = (pointer)&sp.field_2;
  sp._M_string_length = 0;
  sp.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)proto,&sp);
  i32 = std::__cxx11::string::find((string *)&this->file_descriptor_serialized_,(ulong)&sp);
  if (i32 < 0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x4f8);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  this_00 = this->printer_;
  strings::AlphaNum::AlphaNum((AlphaNum *)&local_78,i32);
  StrCat_abi_cxx11_(&local_98,(protobuf *)&local_78,a);
  strings::AlphaNum::AlphaNum(&local_40,(long)i32 + sp._M_string_length);
  StrCat_abi_cxx11_(&local_b8,(protobuf *)&local_40,a_00);
  io::Printer::Print<char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,"serialized_start=$serialized_start$,\nserialized_end=$serialized_end$,\n",
             (char (*) [17])"serialized_start",&local_98,(char (*) [15])"serialized_end",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sp);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(const DescriptorT& descriptor,
                                          DescriptorProtoT& proto) const {
  descriptor.CopyTo(&proto);
  std::string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print(
      "serialized_start=$serialized_start$,\n"
      "serialized_end=$serialized_end$,\n",
      "serialized_start", StrCat(offset), "serialized_end",
      StrCat(offset + sp.size()));
}